

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLock.cxx
# Opt level: O0

void __thiscall cmFileLock::cmFileLock(cmFileLock *this,cmFileLock *other)

{
  cmFileLock *other_local;
  cmFileLock *this_local;
  
  this->File = -1;
  std::__cxx11::string::string((string *)&this->Filename);
  this->File = other->File;
  other->File = -1;
  std::__cxx11::string::operator=((string *)&this->Filename,(string *)&other->Filename);
  return;
}

Assistant:

cmFileLock::cmFileLock(cmFileLock&& other) noexcept
{
  this->File = other.File;
#if defined(_WIN32)
  other.File = INVALID_HANDLE_VALUE;
#else
  other.File = -1;
#endif
  this->Filename = std::move(other.Filename);
}